

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

VdbeOp * sqlite3VdbeTakeOpArray(Vdbe *p,int *pnOp,int *pnMaxArg)

{
  VdbeOp *pVVar1;
  VdbeOp *aOp;
  int *pnMaxArg_local;
  int *pnOp_local;
  Vdbe *p_local;
  
  pVVar1 = p->aOp;
  resolveP2Values(p,pnMaxArg);
  *pnOp = p->nOp;
  p->aOp = (Op *)0x0;
  return pVVar1;
}

Assistant:

SQLITE_PRIVATE VdbeOp *sqlite3VdbeTakeOpArray(Vdbe *p, int *pnOp, int *pnMaxArg){
  VdbeOp *aOp = p->aOp;
  assert( aOp && !p->db->mallocFailed );

  /* Check that sqlite3VdbeUsesBtree() was not called on this VM */
  assert( p->btreeMask==0 );

  resolveP2Values(p, pnMaxArg);
  *pnOp = p->nOp;
  p->aOp = 0;
  return aOp;
}